

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_done(connectdata *conn,CURLcode status,_Bool premature)

{
  anon_union_240_10_26c073a1_for_proto *ftpc;
  char cVar1;
  curl_ftpfile cVar2;
  Curl_easy *data;
  void *pvVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  CURLcode CVar7;
  CURLcode error;
  size_t sVar8;
  size_t sVar9;
  char *pcVar10;
  curl_slist *pcVar11;
  curltime cVar12;
  int ftpcode;
  char *path;
  ssize_t nread;
  ssize_t nread_1;
  int local_50;
  int local_4c;
  char *local_48;
  long local_40;
  ssize_t local_38;
  
  data = conn->data;
  pvVar3 = (data->req).protop;
  local_48 = (char *)0x0;
  if (pvVar3 == (void *)0x0) {
    return CURLE_OK;
  }
  if ((((CURLE_FILESIZE_EXCEEDED < status) ||
       ((0x80000010428e3601U >> ((ulong)status & 0x3f) & 1) == 0)) &&
      (status != CURLE_REMOTE_FILE_NOT_FOUND)) || (CVar7 = CURLE_OK, premature)) {
    (conn->proto).ftpc.ctl_valid = false;
    (conn->proto).ftpc.cwdfail = true;
    Curl_conncontrol(conn,1);
    CVar7 = status;
  }
  (*Curl_cfree)((conn->proto).ftpc.prevpath);
  if (((data->state).field_0x4e4 & 0x80) != 0) {
    if (((data->set).chunk_end != (curl_chunk_end_callback)0x0) &&
       ((conn->proto).ftpc.file != (char *)0x0)) {
      Curl_set_in_callback(data,true);
      (*(data->set).chunk_end)((data->wildcard).customptr);
      Curl_set_in_callback(data,false);
    }
    (conn->proto).ftpc.known_filesize = -1;
  }
  ftpc = &conn->proto;
  if ((CVar7 != CURLE_OK) ||
     (CVar7 = Curl_urldecode(data,*(char **)((long)pvVar3 + 0x10),0,&local_48,(size_t *)0x0,true),
     CVar7 != CURLE_OK)) {
    (conn->proto).ftpc.ctl_valid = false;
    Curl_conncontrol(conn,1);
    (conn->proto).ftpc.prevpath = (char *)0x0;
    freedirs(&ftpc->ftpc);
    if (conn->sock[1] != -1) goto LAB_004d1bca;
    goto LAB_004d1c5b;
  }
  pcVar10 = (conn->proto).ftpc.file;
  if (pcVar10 == (char *)0x0) {
    sVar8 = 0;
  }
  else {
    sVar8 = strlen(pcVar10);
  }
  pcVar10 = local_48;
  sVar9 = strlen(local_48);
  if ((conn->proto).ftpc.cwdfail == false) {
    cVar2 = (data->set).ftp_filemethod;
    (conn->proto).ftpc.prevmethod = cVar2;
    if (cVar2 == FTPFILE_NOCWD || sVar9 == sVar8) {
      (*Curl_cfree)(pcVar10);
      pcVar10 = (*Curl_cstrdup)("");
      (conn->proto).ftpc.prevpath = pcVar10;
      if (pcVar10 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    else {
      (conn->proto).ftpc.prevpath = pcVar10;
      if (sVar8 != 0) {
        pcVar10[sVar9 - sVar8] = '\0';
        pcVar10 = (conn->proto).ftpc.prevpath;
      }
      if (pcVar10 == (char *)0x0) goto LAB_004d1f3e;
    }
    Curl_infof(data,"Remembering we are in dir \"%s\"\n",pcVar10);
  }
  else {
    (conn->proto).ftpc.prevpath = (char *)0x0;
    (*Curl_cfree)(pcVar10);
  }
LAB_004d1f3e:
  freedirs(&ftpc->ftpc);
  if (conn->sock[1] != -1) {
    CVar7 = CURLE_OK;
    if (((conn->proto).ftpc.dont_check == true) && (0 < (data->req).maxdownload)) {
      error = Curl_pp_sendf(&(ftpc->ftpc).pp,"%s","ABOR");
      CVar7 = CURLE_OK;
      if (error != CURLE_OK) {
        pcVar10 = curl_easy_strerror(error);
        Curl_failf(data,"Failure sending ABOR command: %s",pcVar10);
        (conn->proto).ftpc.ctl_valid = false;
        Curl_conncontrol(conn,1);
        CVar7 = error;
      }
    }
LAB_004d1bca:
    if ((conn->ssl[1].field_0x10 & 1) != 0) {
      Curl_ssl_close(conn,1);
    }
    if (conn->sock[1] != -1) {
      Curl_closesocket(conn,conn->sock[1]);
      conn->sock[1] = -1;
    }
    (conn->bits).tcpconnect[1] = false;
    if (CVar7 != CURLE_OK) goto LAB_004d1c5b;
  }
  if (((*(int *)((long)pvVar3 + 0x20) == 0) && ((conn->proto).ftpc.ctl_valid == true)) &&
     ((conn->proto).sshc.authed == true && !premature)) {
    lVar5 = (conn->proto).ftpc.pp.response_time;
    (conn->proto).ftpc.pp.response_time = 60000;
    cVar12 = Curl_now();
    (conn->proto).smbc.send_size = cVar12.tv_sec;
    *(int *)((long)&conn->proto + 0x48) = cVar12.tv_usec;
    CVar7 = Curl_GetFTPResponse(&local_40,conn,&local_50);
    (conn->proto).ftpc.pp.response_time = lVar5;
    if (CVar7 == CURLE_OPERATION_TIMEDOUT && local_40 == 0) {
      Curl_failf(data,"control connection looks dead");
      (conn->proto).ftpc.ctl_valid = false;
      Curl_conncontrol(conn,1);
      return CURLE_OPERATION_TIMEDOUT;
    }
    if (CVar7 != CURLE_OK) {
      return CVar7;
    }
    if ((conn->proto).ftpc.dont_check == true) {
      if (0 < (data->req).maxdownload) {
        Curl_infof(data,"partial download completed, closing connection\n");
        Curl_conncontrol(conn,1);
        return CURLE_OK;
      }
      goto LAB_004d1c2d;
    }
    if ((local_50 == 0xe2) || (local_50 == 0xfa)) goto LAB_004d1c2d;
    Curl_failf(data,"server did not report OK, got %d");
    goto LAB_004d20bb;
  }
LAB_004d1c2d:
  if (premature) {
    *(undefined4 *)((long)pvVar3 + 0x20) = 0;
    (conn->proto).ftpc.dont_check = false;
  }
  else {
    uVar4 = *(ulong *)&(data->set).field_0x878;
    if (((uint)uVar4 >> 0x1d & 1) == 0) {
      lVar5 = (data->req).size;
      if ((((lVar5 == -1) || (lVar6 = (data->req).bytecount, lVar5 == lVar6)) ||
          ((data->state).crlf_conversions + lVar5 == lVar6)) || ((data->req).maxdownload == lVar6))
      {
        CVar7 = CURLE_OK;
        if ((((conn->proto).ftpc.dont_check == false) && (0 < lVar5)) &&
           ((data->req).bytecount == 0)) {
          Curl_failf(data,"No data was received!");
          CVar7 = CURLE_FTP_COULDNT_RETR_FILE;
        }
      }
      else {
        Curl_failf(data,"Received only partial file: %ld bytes");
LAB_004d20bb:
        CVar7 = CURLE_PARTIAL_FILE;
      }
    }
    else {
      lVar5 = (data->state).infilesize;
      CVar7 = CURLE_OK;
      if (((lVar5 != -1) && ((uVar4 & 0x40) == 0)) &&
         ((lVar5 != (data->req).writebytecount && (*(int *)((long)pvVar3 + 0x20) == 0)))) {
        Curl_failf(data,"Uploaded unaligned file size (%ld out of %ld bytes)",(data->req).bytecount)
        ;
        goto LAB_004d20bb;
      }
    }
LAB_004d1c5b:
    *(undefined4 *)((long)pvVar3 + 0x20) = 0;
    (conn->proto).ftpc.dont_check = false;
    if ((status != CURLE_OK || CVar7 != CURLE_OK) || premature) goto LAB_004d1e44;
    pcVar11 = (data->set).postquote;
    if (pcVar11 != (curl_slist *)0x0) {
      do {
        pcVar10 = pcVar11->data;
        if (pcVar10 != (char *)0x0) {
          cVar1 = *pcVar10;
          CVar7 = Curl_pp_sendf(&(ftpc->ftpc).pp,"%s",pcVar10 + (cVar1 == '*'));
          if (CVar7 != CURLE_OK) goto LAB_004d1e44;
          cVar12 = Curl_now();
          (conn->proto).smbc.send_size = cVar12.tv_sec;
          *(int *)((long)&conn->proto + 0x48) = cVar12.tv_usec;
          CVar7 = Curl_GetFTPResponse(&local_38,conn,&local_4c);
          if (CVar7 != CURLE_OK) goto LAB_004d1e44;
          if ((cVar1 != '*') && (399 < local_4c)) {
            Curl_failf(conn->data,"QUOT string not accepted: %s",pcVar10);
            CVar7 = CURLE_QUOTE_ERROR;
            goto LAB_004d1e44;
          }
        }
        pcVar11 = pcVar11->next;
      } while (pcVar11 != (curl_slist *)0x0);
      CVar7 = CURLE_OK;
      goto LAB_004d1e44;
    }
  }
  CVar7 = CURLE_OK;
LAB_004d1e44:
  (*Curl_cfree)(*(void **)((long)pvVar3 + 0x18));
  *(undefined8 *)((long)pvVar3 + 0x18) = 0;
  return CVar7;
}

Assistant:

static CURLcode ftp_done(struct connectdata *conn, CURLcode status,
                         bool premature)
{
  struct Curl_easy *data = conn->data;
  struct FTP *ftp = data->req.protop;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  ssize_t nread;
  int ftpcode;
  CURLcode result = CURLE_OK;
  char *path = NULL;

  if(!ftp)
    return CURLE_OK;

  switch(status) {
  case CURLE_BAD_DOWNLOAD_RESUME:
  case CURLE_FTP_WEIRD_PASV_REPLY:
  case CURLE_FTP_PORT_FAILED:
  case CURLE_FTP_ACCEPT_FAILED:
  case CURLE_FTP_ACCEPT_TIMEOUT:
  case CURLE_FTP_COULDNT_SET_TYPE:
  case CURLE_FTP_COULDNT_RETR_FILE:
  case CURLE_PARTIAL_FILE:
  case CURLE_UPLOAD_FAILED:
  case CURLE_REMOTE_ACCESS_DENIED:
  case CURLE_FILESIZE_EXCEEDED:
  case CURLE_REMOTE_FILE_NOT_FOUND:
  case CURLE_WRITE_ERROR:
    /* the connection stays alive fine even though this happened */
    /* fall-through */
  case CURLE_OK: /* doesn't affect the control connection's status */
    if(!premature)
      break;

    /* until we cope better with prematurely ended requests, let them
     * fallback as if in complete failure */
    /* FALLTHROUGH */
  default:       /* by default, an error means the control connection is
                    wedged and should not be used anymore */
    ftpc->ctl_valid = FALSE;
    ftpc->cwdfail = TRUE; /* set this TRUE to prevent us to remember the
                             current path, as this connection is going */
    connclose(conn, "FTP ended with bad error code");
    result = status;      /* use the already set error code */
    break;
  }

  /* now store a copy of the directory we are in */
  free(ftpc->prevpath);

  if(data->state.wildcardmatch) {
    if(data->set.chunk_end && ftpc->file) {
      Curl_set_in_callback(data, true);
      data->set.chunk_end(data->wildcard.customptr);
      Curl_set_in_callback(data, false);
    }
    ftpc->known_filesize = -1;
  }

  if(!result)
    /* get the "raw" path */
    result = Curl_urldecode(data, ftp->path, 0, &path, NULL, TRUE);
  if(result) {
    /* We can limp along anyway (and should try to since we may already be in
     * the error path) */
    ftpc->ctl_valid = FALSE; /* mark control connection as bad */
    connclose(conn, "FTP: out of memory!"); /* mark for connection closure */
    ftpc->prevpath = NULL; /* no path remembering */
  }
  else {
    size_t flen = ftpc->file?strlen(ftpc->file):0; /* file is "raw" already */
    size_t dlen = strlen(path)-flen;
    if(!ftpc->cwdfail) {
      ftpc->prevmethod = data->set.ftp_filemethod;
      if(dlen && (data->set.ftp_filemethod != FTPFILE_NOCWD)) {
        ftpc->prevpath = path;
        if(flen)
          /* if 'path' is not the whole string */
          ftpc->prevpath[dlen] = 0; /* terminate */
      }
      else {
        free(path);
        /* we never changed dir */
        ftpc->prevpath = strdup("");
        if(!ftpc->prevpath)
          return CURLE_OUT_OF_MEMORY;
      }
      if(ftpc->prevpath)
        infof(data, "Remembering we are in dir \"%s\"\n", ftpc->prevpath);
    }
    else {
      ftpc->prevpath = NULL; /* no path */
      free(path);
    }
  }
  /* free the dir tree and file parts */
  freedirs(ftpc);

  /* shut down the socket to inform the server we're done */

#ifdef _WIN32_WCE
  shutdown(conn->sock[SECONDARYSOCKET], 2);  /* SD_BOTH */
#endif

  if(conn->sock[SECONDARYSOCKET] != CURL_SOCKET_BAD) {
    if(!result && ftpc->dont_check && data->req.maxdownload > 0) {
      /* partial download completed */
      result = Curl_pp_sendf(pp, "%s", "ABOR");
      if(result) {
        failf(data, "Failure sending ABOR command: %s",
              curl_easy_strerror(result));
        ftpc->ctl_valid = FALSE; /* mark control connection as bad */
        connclose(conn, "ABOR command failed"); /* connection closure */
      }
    }

    if(conn->ssl[SECONDARYSOCKET].use) {
      /* The secondary socket is using SSL so we must close down that part
         first before we close the socket for real */
      Curl_ssl_close(conn, SECONDARYSOCKET);

      /* Note that we keep "use" set to TRUE since that (next) connection is
         still requested to use SSL */
    }
    close_secondarysocket(conn);
  }

  if(!result && (ftp->transfer == FTPTRANSFER_BODY) && ftpc->ctl_valid &&
     pp->pending_resp && !premature) {
    /*
     * Let's see what the server says about the transfer we just performed,
     * but lower the timeout as sometimes this connection has died while the
     * data has been transferred. This happens when doing through NATs etc that
     * abandon old silent connections.
     */
    long old_time = pp->response_time;

    pp->response_time = 60*1000; /* give it only a minute for now */
    pp->response = Curl_now(); /* timeout relative now */

    result = Curl_GetFTPResponse(&nread, conn, &ftpcode);

    pp->response_time = old_time; /* set this back to previous value */

    if(!nread && (CURLE_OPERATION_TIMEDOUT == result)) {
      failf(data, "control connection looks dead");
      ftpc->ctl_valid = FALSE; /* mark control connection as bad */
      connclose(conn, "Timeout or similar in FTP DONE operation"); /* close */
    }

    if(result)
      return result;

    if(ftpc->dont_check && data->req.maxdownload > 0) {
      /* we have just sent ABOR and there is no reliable way to check if it was
       * successful or not; we have to close the connection now */
      infof(data, "partial download completed, closing connection\n");
      connclose(conn, "Partial download with no ability to check");
      return result;
    }

    if(!ftpc->dont_check) {
      /* 226 Transfer complete, 250 Requested file action okay, completed. */
      if((ftpcode != 226) && (ftpcode != 250)) {
        failf(data, "server did not report OK, got %d", ftpcode);
        result = CURLE_PARTIAL_FILE;
      }
    }
  }

  if(result || premature)
    /* the response code from the transfer showed an error already so no
       use checking further */
    ;
  else if(data->set.upload) {
    if((-1 != data->state.infilesize) &&
       (data->state.infilesize != data->req.writebytecount) &&
       !data->set.crlf &&
       (ftp->transfer == FTPTRANSFER_BODY)) {
      failf(data, "Uploaded unaligned file size (%" CURL_FORMAT_CURL_OFF_T
            " out of %" CURL_FORMAT_CURL_OFF_T " bytes)",
            data->req.bytecount, data->state.infilesize);
      result = CURLE_PARTIAL_FILE;
    }
  }
  else {
    if((-1 != data->req.size) &&
       (data->req.size != data->req.bytecount) &&
#ifdef CURL_DO_LINEEND_CONV
       /* Most FTP servers don't adjust their file SIZE response for CRLFs, so
        * we'll check to see if the discrepancy can be explained by the number
        * of CRLFs we've changed to LFs.
        */
       ((data->req.size + data->state.crlf_conversions) !=
        data->req.bytecount) &&
#endif /* CURL_DO_LINEEND_CONV */
       (data->req.maxdownload != data->req.bytecount)) {
      failf(data, "Received only partial file: %" CURL_FORMAT_CURL_OFF_T
            " bytes", data->req.bytecount);
      result = CURLE_PARTIAL_FILE;
    }
    else if(!ftpc->dont_check &&
            !data->req.bytecount &&
            (data->req.size>0)) {
      failf(data, "No data was received!");
      result = CURLE_FTP_COULDNT_RETR_FILE;
    }
  }

  /* clear these for next connection */
  ftp->transfer = FTPTRANSFER_BODY;
  ftpc->dont_check = FALSE;

  /* Send any post-transfer QUOTE strings? */
  if(!status && !result && !premature && data->set.postquote)
    result = ftp_sendquote(conn, data->set.postquote);
  Curl_safefree(ftp->pathalloc);
  return result;
}